

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIvy.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkIvyResyn(Abc_Ntk_t *pNtk,int fUpdateLevel,int fVerbose)

{
  Ivy_Man_t *pMan;
  Ivy_Man_t *pMan_00;
  Abc_Ntk_t *pAVar1;
  
  pMan = Abc_NtkIvyBefore(pNtk,0,0);
  if (pMan == (Ivy_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    pMan_00 = Ivy_ManResyn(pMan,fUpdateLevel,fVerbose);
    Ivy_ManStop(pMan);
    pAVar1 = Abc_NtkIvyAfter(pNtk,pMan_00,0,0);
    Ivy_ManStop(pMan_00);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkIvyResyn( Abc_Ntk_t * pNtk, int fUpdateLevel, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Ivy_Man_t * pMan, * pTemp;
    pMan = Abc_NtkIvyBefore( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
    pMan = Ivy_ManResyn( pTemp = pMan, fUpdateLevel, fVerbose );
    Ivy_ManStop( pTemp );
    pNtkAig = Abc_NtkIvyAfter( pNtk, pMan, 0, 0 );
    Ivy_ManStop( pMan );
    return pNtkAig;
}